

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O0

void flat_radixsort(vector<unsigned_long,_std::allocator<unsigned_long>_> *data,uint64_t max_fileid)

{
  int iVar1;
  uint32_t in_ESI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  int shift;
  int skip_to;
  vector<unsigned_long,_std::allocator<unsigned_long>_> swap;
  int in_stack_000007f4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_000007f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000800;
  undefined4 local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_type in_stack_ffffffffffffffc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1fd3cb);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1fd3ea);
  iVar1 = count_bytes(in_ESI);
  iVar1 = iVar1 << 3;
  for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 8) {
    if ((local_44 < iVar1) || (0x27 < local_44)) {
      countsort(in_stack_00000800,in_stack_000007f8,in_stack_000007f4);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,iVar1));
  return;
}

Assistant:

void flat_radixsort(std::vector<uint64_t> *data, uint64_t max_fileid) {
    std::vector<uint64_t> swap(data->size());
    int skip_to = count_bytes(max_fileid) * 8;
    for (int shift = 0; shift < 64; shift += 8) {
        if (shift >= skip_to && shift < 40) {
            continue;
        }
        countsort(data, &swap, shift);
    }
}